

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.h
# Opt level: O2

string * __thiscall Proxy::ToString_abi_cxx11_(string *__return_storage_ptr__,Proxy *this)

{
  long in_FS_OFFSET;
  
  if (this->m_is_unix_socket == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
LAB_00186553:
      __stack_chk_fail();
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,&this->m_unix_socket_path);
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) goto LAB_00186553;
    CService::ToStringAddrPort_abi_cxx11_(__return_storage_ptr__,&this->proxy);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        if (m_is_unix_socket) return m_unix_socket_path;
        return proxy.ToStringAddrPort();
    }